

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsItemPrivate::setVisibleHelper
          (QGraphicsItemPrivate *this,bool newVisible,bool explicitly,bool update,bool hiddenByPanel
          )

{
  long lVar1;
  undefined8 *puVar2;
  QGraphicsItem *this_00;
  QGraphicsItem **ppQVar3;
  QGraphicsItemPrivate *pQVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  WindowType WVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  QMetaType QVar12;
  QGraphicsItem *pQVar13;
  QGraphicsItem *pQVar14;
  QGraphicsItemPrivate *pQVar15;
  undefined7 in_register_00000011;
  long lVar16;
  QVariant *pQVar17;
  anon_union_24_3_e3d07ef4_for_data *this_01;
  undefined8 this_02;
  QGraphicsWidget *widget;
  long in_FS_OFFSET;
  QMetaType local_a8;
  QMetaType local_a0;
  QVariant local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  ulong uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = *(ulong *)&this->field_0x160;
  if ((int)CONCAT71(in_register_00000011,explicitly) != 0) {
    uVar10 = uVar10 & 0xffffffffffffffbf | (ulong)!newVisible << 6;
    *(ulong *)&this->field_0x160 = uVar10;
  }
  if (((uVar10 & 0x20) == 0) != newVisible) goto LAB_005d7b26;
  this_00 = this->q_ptr;
  if ((newVisible && this->parent != (QGraphicsItem *)0x0) &&
     ((((this->parent->d_ptr).d)->field_0x160 & 0x20) == 0)) goto LAB_005d7b26;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = &local_78;
  ::QVariant::QVariant((QVariant *)this_01,(uint)newVisible);
  (*this_00->_vptr_QGraphicsItem[0x21])(&local_58,this_00,2,this_01);
  ::QVariant::~QVariant((QVariant *)this_01);
  bVar5 = (bool)::QVariant::toBool();
  if (((*(ulong *)&this->field_0x160 & 0x20) == 0) == bVar5) {
    *(ulong *)&this->field_0x160 =
         *(ulong *)&this->field_0x160 & 0xffffffffffffffdf | (ulong)bVar5 << 5;
    if (update) {
      lVar11 = (this->extras).d.size;
      if (lVar11 != 0) {
        pQVar17 = &((this->extras).d.ptr)->value;
        do {
          if (*(int *)&pQVar17[-1].d.field_0x18 == 2) {
            ::QVariant::QVariant((QVariant *)&local_78,pQVar17);
            local_a8.d_ptr = (QMetaTypeInterface *)(uStack_60 & 0xfffffffffffffffc);
            goto LAB_005d7559;
          }
          pQVar17 = (QVariant *)((long)&pQVar17[1].d.data + 8);
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = 0;
      local_78._16_8_ = 0;
      uStack_60 = 2;
      local_a8.d_ptr = (QMetaTypeInterface *)0x0;
LAB_005d7559:
      local_a0.d_ptr = (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<void*>::metaType;
      bVar6 = comparesEqual(&local_a8,&local_a0);
      if (bVar6) {
        this_02 = local_78.shared;
        if ((uStack_60 & 1) != 0) {
          this_02 = *(undefined8 *)(local_78.shared + *(int *)(local_78.shared + 4));
        }
      }
      else {
        local_a8.d_ptr = (QMetaTypeInterface *)0x0;
        QVar12.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((uStack_60 & 1) != 0) {
          this_01 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_78.shared + *(int *)(local_78.shared + 4));
        }
        QMetaType::convert(QVar12,this_01,local_a0,&local_a8);
        this_02 = local_a8.d_ptr;
      }
      ::QVariant::~QVariant((QVariant *)&local_78);
      if ((QMetaTypeInterface *)this_02 != (QMetaTypeInterface *)0x0) {
        QGraphicsItemCache::purge((QGraphicsItemCache *)this_02);
      }
      if (this->scene != (QGraphicsScene *)0x0) {
        invalidateParentGraphicsEffectsRecursively(this);
        local_78._16_8_ = 0;
        uStack_60 = 0;
        local_78.shared = (PrivateShared *)0x0;
        local_78._8_8_ = 0;
        QGraphicsScenePrivate::markDirty
                  (*(QGraphicsScenePrivate **)&this->scene->field_0x8,this->q_ptr,
                   (QRectF *)&local_78,false,true,false,false,false);
      }
    }
    bVar6 = QGraphicsItem::hasFocus(this->q_ptr);
    if (bVar5 == false) {
      if (this->scene != (QGraphicsScene *)0x0) {
        lVar11 = *(long *)&this->scene->field_0x8;
        if (*(long *)(lVar11 + 0x1f0) != 0) {
          lVar16 = 0;
          do {
            if (*(long *)(lVar11 + 0x1f0) << 3 == lVar16) goto LAB_005d774b;
            lVar1 = lVar16 + 8;
            puVar2 = (undefined8 *)(*(long *)(lVar11 + 0x1e8) + lVar16);
            lVar16 = lVar1;
          } while ((QGraphicsItem *)*puVar2 != this_00);
          if (lVar1 != 0) {
            QGraphicsItem::ungrabMouse(this_00);
            lVar11 = *(long *)&this->scene->field_0x8;
          }
        }
LAB_005d774b:
        if (*(long *)(lVar11 + 0x208) != 0) {
          lVar16 = 0;
          do {
            if (*(long *)(lVar11 + 0x208) << 3 == lVar16) goto LAB_005d7783;
            lVar1 = lVar16 + 8;
            puVar2 = (undefined8 *)(*(long *)(lVar11 + 0x200) + lVar16);
            lVar16 = lVar1;
          } while ((QGraphicsItem *)*puVar2 != this_00);
          if (lVar1 != 0) {
            QGraphicsItem::ungrabKeyboard(this_00);
          }
        }
LAB_005d7783:
        if (((*(ulong *)&((this_00->d_ptr).d)->field_0x160 & 0x400000000000) != 0) &&
           (this->panelModality != NonModal)) {
          QGraphicsScenePrivate::leaveModal
                    (*(QGraphicsScenePrivate **)&this->scene->field_0x8,this->q_ptr);
        }
      }
      if ((bVar6) && ((QGraphicsScene *)this->scene != (QGraphicsScene *)0x0)) {
        pQVar14 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene);
        if (((this->field_0x163 & 1) != 0) &&
           (pQVar15 = (pQVar14->d_ptr).d, (*(ulong *)&pQVar15->field_0x160 & 0x400000000000) == 0))
        {
          pQVar13 = this->q_ptr;
          while (pQVar14 != pQVar13) {
            do {
              pQVar14 = pQVar15->parent;
              if (pQVar14 == (QGraphicsItem *)0x0) goto LAB_005d7825;
              pQVar15 = (pQVar14->d_ptr).d;
            } while (((uint)*(ulong *)&pQVar15->field_0x160 >> 0x18 & 1) == 0);
            if ((*(ulong *)&pQVar15->field_0x160 & 0x400000000000) != 0) goto LAB_005d7825;
          }
          iVar9 = (*pQVar13[-1]._vptr_QGraphicsItem[0x1e])(pQVar13 + -1);
          if ((char)iVar9 != '\0') goto LAB_005d7834;
        }
LAB_005d7825:
        clearFocusHelper(this,false,hiddenByPanel);
      }
LAB_005d7834:
      bVar7 = QGraphicsItem::isSelected(this->q_ptr);
      if (bVar7) {
        QGraphicsItem::setSelected(this->q_ptr,false);
      }
    }
    else {
      uVar10 = *(ulong *)&this->field_0x160;
      *(ulong *)&this->field_0x160 = uVar10 | 0x50000000000000;
      if (this->scene != (QGraphicsScene *)0x0) {
        if (((uint)uVar10 >> 0x18 & 1) != 0) {
          widget = (QGraphicsWidget *)(this->q_ptr + -1);
          if (this->q_ptr == (QGraphicsItem *)0x0) {
            widget = (QGraphicsWidget *)0x0;
          }
          WVar8 = QGraphicsWidget::windowType((QGraphicsWidget *)widget);
          if (WVar8 == Popup) {
            QGraphicsScenePrivate::addPopup
                      (*(QGraphicsScenePrivate **)&this->scene->field_0x8,widget);
          }
        }
        if (((*(ulong *)&((this_00->d_ptr).d)->field_0x160 & 0x400000000000) != 0) &&
           (this->panelModality != NonModal)) {
          QGraphicsScenePrivate::enterModal
                    (*(QGraphicsScenePrivate **)&this->scene->field_0x8,this->q_ptr,NonModal);
        }
      }
    }
    if (update) {
      if ((*(ulong *)&this->field_0x160 & 0x8001000000000) == 0) {
        bVar7 = true;
      }
      else {
        bVar7 = (bool)((byte)(uint)(*(ulong *)&this->field_0x160 >> 0x2a) & 1);
      }
    }
    else {
      bVar7 = false;
    }
    lVar11 = (this->children).d.size;
    if (lVar11 != 0) {
      ppQVar3 = (this->children).d.ptr;
      lVar16 = 0;
      do {
        pQVar15 = *(QGraphicsItemPrivate **)(*(long *)((long)ppQVar3 + lVar16) + 8);
        if ((bVar5 == false) || ((pQVar15->field_0x160 & 0x40) == 0)) {
          setVisibleHelper(pQVar15,bVar5,false,bVar7,hiddenByPanel);
        }
        lVar16 = lVar16 + 8;
      } while (lVar11 << 3 != lVar16);
    }
    if (this->scene != (QGraphicsScene *)0x0) {
      if ((*(ulong *)&((this_00->d_ptr).d)->field_0x160 & 0x400000000000) != 0) {
        if (bVar5 == false) {
          bVar7 = QGraphicsItem::isActive(this_00);
          if (bVar7) {
            QGraphicsScene::setActivePanel((QGraphicsScene *)this->scene,this->parent);
          }
        }
        else if ((this->parent != (QGraphicsItem *)0x0) &&
                (bVar7 = QGraphicsItem::isActive(this->parent), bVar7)) {
          QGraphicsItem::setActive(this_00,true);
        }
      }
      if (this->scene != (QGraphicsScene *)0x0) {
        pQVar14 = this->parent;
        if (bVar5 == false) {
          if (bVar6 && pQVar14 != (QGraphicsItem *)0x0) {
            do {
              pQVar15 = (pQVar14->d_ptr).d;
              if ((*(ulong *)&pQVar15->field_0x160 & 0x800000000000) != 0) {
                if ((*(ulong *)&pQVar15->field_0x160 & 0x20) != 0) {
                  bVar5 = true;
                  goto LAB_005d7ac6;
                }
                break;
              }
              pQVar14 = pQVar15->parent;
            } while (pQVar14 != (QGraphicsItem *)0x0);
          }
        }
        else {
          while (pQVar14 != (QGraphicsItem *)0x0) {
            pQVar15 = (pQVar14->d_ptr).d;
            if ((*(ulong *)&pQVar15->field_0x160 & 0x800000000000) != 0) {
              pQVar14 = pQVar15->focusScopeItem;
              if ((this->q_ptr == pQVar14) ||
                 (bVar5 = QGraphicsItem::isAncestorOf(this->q_ptr,pQVar14), bVar5)) {
                pQVar4 = (pQVar14->d_ptr).d;
                goto LAB_005d7a0d;
              }
              break;
            }
            pQVar14 = pQVar15->parent;
          }
          pQVar14 = this->subFocusItem;
          if ((pQVar14 == (QGraphicsItem *)0x0) ||
             (pQVar13 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene), pQVar14 == pQVar13
             )) {
            if ((((*(ulong *)&this->field_0x160 & 0x800000000000) != 0) &&
                (pQVar14 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene),
                pQVar14 == (QGraphicsItem *)0x0)) &&
               (bVar5 = QGraphicsItem::isAncestorOf
                                  (this_00,*(QGraphicsItem **)
                                            (*(long *)&this->scene->field_0x8 + 400)), bVar5)) {
              pQVar15 = (this->q_ptr->d_ptr).d;
              goto LAB_005d7aa5;
            }
          }
          else {
            QGraphicsScene::setFocusItem((QGraphicsScene *)this->scene,pQVar14,OtherFocusReason);
          }
        }
      }
    }
    goto LAB_005d7acb;
  }
  goto LAB_005d7b1c;
  while (pQVar4 = (pQVar15->focusScopeItem->d_ptr).d, (pQVar4->field_0x160 & 0x20) != 0) {
LAB_005d7a0d:
    pQVar15 = pQVar4;
    if (pQVar15->focusScopeItem == (QGraphicsItem *)0x0) break;
  }
LAB_005d7aa5:
  bVar5 = false;
LAB_005d7ac6:
  setFocusHelper(pQVar15,OtherFocusReason,true,bVar5);
LAB_005d7acb:
  (*this->q_ptr->_vptr_QGraphicsItem[0x21])(&local_98,this->q_ptr,0xc);
  ::QVariant::~QVariant(&local_98);
  if ((this->field_0x167 & 1) != 0) {
    QMetaObject::activate
              ((QObject *)(this->q_ptr + -1),&QGraphicsObject::staticMetaObject,2,(void **)0x0);
  }
LAB_005d7b1c:
  ::QVariant::~QVariant((QVariant *)&local_58);
LAB_005d7b26:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::setVisibleHelper(bool newVisible, bool explicitly,
                                            bool update, bool hiddenByPanel)
{
    Q_Q(QGraphicsItem);

    // Update explicit bit.
    if (explicitly)
        explicitlyHidden = newVisible ? 0 : 1;

    // Check if there's nothing to do.
    if (visible == quint32(newVisible))
        return;

    // Don't show child if parent is not visible
    if (parent && newVisible && !parent->d_ptr->visible)
        return;

    // Modify the property.
    const QVariant newVisibleVariant(q_ptr->itemChange(QGraphicsItem::ItemVisibleChange,
                                                       quint32(newVisible)));
    newVisible = newVisibleVariant.toBool();
    if (visible == quint32(newVisible))
        return;
    visible = newVisible;

    // Schedule redrawing
    if (update) {
        QGraphicsItemCache *c = (QGraphicsItemCache *)qvariant_cast<void *>(extra(ExtraCacheData));
        if (c)
            c->purge();
        if (scene) {
#if QT_CONFIG(graphicseffect)
            invalidateParentGraphicsEffectsRecursively();
#endif // QT_CONFIG(graphicseffect)
            scene->d_func()->markDirty(q_ptr, QRectF(), /*invalidateChildren=*/false, /*force=*/true);
        }
    }

    // Certain properties are dropped as an item becomes invisible.
    bool hasFocus = q_ptr->hasFocus();
    if (!newVisible) {
        if (scene) {
            if (scene->d_func()->mouseGrabberItems.contains(q))
                q->ungrabMouse();
            if (scene->d_func()->keyboardGrabberItems.contains(q))
                q->ungrabKeyboard();
            if (q->isPanel() && panelModality != QGraphicsItem::NonModal)
                scene->d_func()->leaveModal(q_ptr);
        }
        if (hasFocus && scene) {
            // Hiding the focus item or the closest non-panel ancestor of the focus item
            QGraphicsItem *focusItem = scene->focusItem();
            bool clear = true;
            if (isWidget && !focusItem->isPanel()) {
                do {
                    if (focusItem == q_ptr) {
                        clear = !static_cast<QGraphicsWidget *>(q_ptr)->focusNextPrevChild(true);
                        break;
                    }
                } while ((focusItem = focusItem->parentWidget()) && !focusItem->isPanel());
            }
            if (clear)
                clearFocusHelper(/* giveFocusToParent = */ false, hiddenByPanel);
        }
        if (q_ptr->isSelected())
            q_ptr->setSelected(false);
    } else {
        geometryChanged = 1;
        paintedViewBoundingRectsNeedRepaint = 1;
        if (scene) {
            if (isWidget) {
                QGraphicsWidget *widget = static_cast<QGraphicsWidget *>(q_ptr);
                if (widget->windowType() == Qt::Popup)
                    scene->d_func()->addPopup(widget);
            }
            if (q->isPanel() && panelModality != QGraphicsItem::NonModal) {
                scene->d_func()->enterModal(q_ptr);
            }
        }
    }

    // Update children with explicitly = false.
    const bool updateChildren = update && !((flags & QGraphicsItem::ItemClipsChildrenToShape
                                             || flags & QGraphicsItem::ItemContainsChildrenInShape)
                                            && !(flags & QGraphicsItem::ItemHasNoContents));
    for (QGraphicsItem *child : std::as_const(children)) {
        if (!newVisible || !child->d_ptr->explicitlyHidden)
            child->d_ptr->setVisibleHelper(newVisible, false, updateChildren, hiddenByPanel);
    }

    // Update activation
    if (scene && q->isPanel()) {
        if (newVisible) {
            if (parent && parent->isActive())
                q->setActive(true);
        } else {
            if (q->isActive())
                scene->setActivePanel(parent);
        }
    }

    // Enable subfocus
    if (scene) {
        if (newVisible) {
            // Item is shown
            QGraphicsItem *p = parent;
            bool done = false;
            while (p) {
                if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
                    QGraphicsItem *fsi = p->d_ptr->focusScopeItem;
                    if (q_ptr == fsi || q_ptr->isAncestorOf(fsi)) {
                        done = true;
                        while (fsi->d_ptr->focusScopeItem && fsi->d_ptr->focusScopeItem->isVisible())
                            fsi = fsi->d_ptr->focusScopeItem;
                        fsi->d_ptr->setFocusHelper(Qt::OtherFocusReason, /* climb = */ true,
                                                   /* focusFromHide = */ false);
                    }
                    break;
                }
                p = p->d_ptr->parent;
            }
            if (!done) {
                QGraphicsItem *fi = subFocusItem;
                if (fi && fi != scene->focusItem()) {
                    scene->setFocusItem(fi);
                } else if (flags & QGraphicsItem::ItemIsFocusScope &&
                           !scene->focusItem() &&
                           q->isAncestorOf(scene->d_func()->lastFocusItem)) {
                    q_ptr->setFocus();
                }
            }
        } else {
            // Item is hidden
            if (hasFocus) {
                QGraphicsItem *p = parent;
                while (p) {
                    if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
                        if (p->d_ptr->visible) {
                            p->d_ptr->setFocusHelper(Qt::OtherFocusReason, /* climb = */ true,
                                                     /* focusFromHide = */ true);
                        }
                        break;
                    }
                    p = p->d_ptr->parent;
                }
            }
        }
    }

    // Deliver post-change notification.
    q_ptr->itemChange(QGraphicsItem::ItemVisibleHasChanged, newVisibleVariant);

    if (isObject)
        emit static_cast<QGraphicsObject *>(q_ptr)->visibleChanged();
}